

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QCursor __thiscall QGraphicsItem::cursor(QGraphicsItem *this)

{
  ulong uVar1;
  int *piVar2;
  bool bVar3;
  QCursorData *__old_val;
  QMetaType QVar4;
  undefined8 uVar5;
  QCursor *t;
  long in_RSI;
  int *piVar6;
  QCursorData *pQVar7;
  anon_union_24_3_e3d07ef4_for_data *paVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QMetaType local_58;
  QMetaType local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  ulong local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ulong *)(*(long *)(in_RSI + 8) + 0x18);
  if (uVar1 == 0) {
LAB_005e88c7:
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
  }
  else {
    piVar6 = *(int **)(*(long *)(in_RSI + 8) + 0x10);
    if (*piVar6 == 1) {
      ::QVariant::QVariant((QVariant *)&local_48,(QVariant *)(piVar6 + 2));
    }
    else {
      uVar9 = 0;
      do {
        piVar2 = piVar6;
        piVar6 = piVar2 + 10;
        if (uVar1 - 1 == uVar9) goto LAB_005e88c7;
        uVar9 = uVar9 + 1;
      } while (*piVar6 != 1);
      ::QVariant::QVariant((QVariant *)&local_48,(QVariant *)(piVar2 + 0xc));
      if (uVar1 <= uVar9) goto LAB_005e88c7;
    }
  }
  local_50.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QCursor>::metaType;
  local_58.d_ptr = (QMetaTypeInterface *)(local_30 & 0xfffffffffffffffc);
  bVar3 = comparesEqual(&local_58,&local_50);
  uVar5 = local_48.shared;
  if (bVar3) {
    if ((local_30 & 1) == 0) {
      local_48.shared = (PrivateShared *)0x0;
    }
    else {
      pQVar7 = (QCursorData *)(local_48.shared + *(int *)(local_48.shared + 4));
      if (*(int *)local_48.shared != 1) {
        QCursor::QCursor((QCursor *)this,(QCursor *)pQVar7);
        goto LAB_005e898e;
      }
      uVar5 = *(undefined8 *)pQVar7;
      *(undefined8 *)pQVar7 = 0;
    }
    this->_vptr_QGraphicsItem = (_func_int **)uVar5;
  }
  else {
    this->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QCursor::QCursor((QCursor *)this);
    paVar8 = &local_48;
    QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_30 & 1) != 0) {
      paVar8 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_48.shared + *(int *)(local_48.shared + 4));
    }
    QMetaType::convert(QVar4,paVar8,local_50,this);
  }
LAB_005e898e:
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QCursor)(QCursorData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QCursor QGraphicsItem::cursor() const
{
    return qvariant_cast<QCursor>(d_ptr->extra(QGraphicsItemPrivate::ExtraCursor));
}